

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O1

amrex_parser * amrex::amrex_parser_new(void)

{
  amrex_parser *my_parser;
  size_t __size;
  void *pvVar1;
  parser_node *ppVar2;
  
  my_parser = (amrex_parser *)malloc(0x20);
  __size = parser_ast_size(parser_root);
  my_parser->sz_mempool = __size;
  pvVar1 = malloc(__size);
  my_parser->p_root = pvVar1;
  my_parser->p_free = pvVar1;
  ppVar2 = parser_ast_dup(my_parser,parser_root,1);
  my_parser->ast = ppVar2;
  if ((void *)((long)my_parser->p_root + my_parser->sz_mempool) != my_parser->p_free) {
    Abort_host("amrex_parser_new: error in memory size");
  }
  parser_ast_optimize(my_parser->ast);
  return my_parser;
}

Assistant:

struct amrex_parser*
amrex_parser_new ()
{
    auto my_parser = (struct amrex_parser*) std::malloc(sizeof(struct amrex_parser));

    my_parser->sz_mempool = parser_ast_size(parser_root);
    my_parser->p_root = std::malloc(my_parser->sz_mempool);
    my_parser->p_free = my_parser->p_root;

    my_parser->ast = parser_ast_dup(my_parser, parser_root, 1); /* 1: free the source parser_root */

    if ((char*)my_parser->p_root + my_parser->sz_mempool != (char*)my_parser->p_free) {
        amrex::Abort("amrex_parser_new: error in memory size");
    }

    parser_ast_optimize(my_parser->ast);

    return my_parser;
}